

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnforcePortSuffix.cpp
# Opt level: O2

bool __thiscall EnforcePortSuffix::check(EnforcePortSuffix *this,RootSymbol *root)

{
  MainVisitor visitor;
  TidyVisitor local_30;
  
  TidyVisitor::TidyVisitor(&local_30,&(this->super_TidyCheck).diagnostics);
  slang::ast::Symbol::visit<enforce_port_suffix::MainVisitor&>
            (&root->super_Symbol,(MainVisitor *)&local_30);
  return (this->super_TidyCheck).diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
         super_SmallVectorBase<slang::Diagnostic>.len == 0;
}

Assistant:

bool check(const ast::RootSymbol& root) override {
        MainVisitor visitor(diagnostics);
        root.visit(visitor);
        return diagnostics.empty();
    }